

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * cmTargetPropertyComputer::GetSources<cmTarget>
                 (cmTarget *tgt,cmMessenger *messenger,cmListFileBacktrace *context)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  size_type sVar7;
  cmSourceFile *this;
  cmSourceFileLocation *pcVar8;
  ostream *poVar9;
  PolicyID id;
  _Alloc_hider _Var10;
  char *pcVar11;
  pointer arg;
  pointer str1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_360;
  string objLibName;
  ostringstream e;
  long local_318;
  ostringstream ss;
  
  _Var1._M_head_impl =
       (tgt->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  arg = *(pointer *)
         &((_Var1._M_head_impl)->SourceEntries).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  pbVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->SourceEntries + 8);
  if (arg == pbVar2) {
    _Var10._M_p = (pointer)0x0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    pcVar11 = "";
    for (; arg != pbVar2; arg = arg + 1) {
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(arg,&files,false);
      pbVar3 = files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (str1 = files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; str1 != pbVar3; str1 = str1 + 1) {
        bVar4 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                          (str1,(char (*) [18])"$<TARGET_OBJECTS:");
        if ((bVar4) && ((str1->_M_dataplus)._M_p[str1->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&objLibName,(ulong)str1);
          sVar7 = cmGeneratorExpression::Find(&objLibName);
          if (sVar7 == 0xffffffffffffffff) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            cmListFileBacktrace::GetBottom((cmStateSnapshot *)&local_360,context);
            PVar5 = cmStateSnapshot::GetPolicy((cmStateSnapshot *)&local_360,CMP0051,false);
            if (PVar5 - NEW < 3) {
              std::operator<<((ostream *)&ss,pcVar11);
              std::operator<<((ostream *)&ss,(string *)str1);
              pcVar11 = ";";
            }
            else if (PVar5 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_360,(cmPolicies *)0x33,id);
              poVar9 = std::operator<<((ostream *)&e,(string *)&local_360);
              std::operator<<(poVar9,"\n");
              std::__cxx11::string::~string((string *)&local_360);
              poVar9 = std::operator<<((ostream *)&e,"Target \"");
              poVar9 = std::operator<<(poVar9,(string *)
                                              &((tgt->impl)._M_t.
                                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                                .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                               _M_head_impl)->Name);
              std::operator<<(poVar9,
                              "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                             );
              std::__cxx11::stringbuf::str();
              cmMessenger::IssueMessage(messenger,AUTHOR_WARNING,&local_360,context);
              std::__cxx11::string::~string((string *)&local_360);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
          else {
            std::operator<<((ostream *)&ss,pcVar11);
            std::operator<<((ostream *)&ss,(string *)str1);
            pcVar11 = ";";
          }
          std::__cxx11::string::~string((string *)&objLibName);
        }
        else {
          sVar7 = cmGeneratorExpression::Find(str1);
          if (sVar7 == 0xffffffffffffffff) {
            std::operator<<((ostream *)&ss,pcVar11);
            std::operator<<((ostream *)&ss,(string *)str1);
            pcVar11 = ";";
          }
          else {
            this = cmMakefile::GetOrCreateSource
                             (((tgt->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              Makefile,str1,false,Ambiguous);
            pcVar8 = cmSourceFile::GetLocation(this);
            std::__cxx11::string::string((string *)&e,(string *)&pcVar8->Directory);
            if (local_318 != 0) {
              std::__cxx11::string::append((char *)&e);
            }
            std::__cxx11::string::append((string *)&e);
            std::operator<<((ostream *)&ss,pcVar11);
            std::operator<<((ostream *)&ss,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
            pcVar11 = ";";
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&files);
    }
    if (GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_ == '\0') {
      iVar6 = __cxa_guard_acquire(&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                                   ::srcs_abi_cxx11_);
      if (iVar6 != 0) {
        GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                       ::srcs_abi_cxx11_.field_2;
        GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_._M_string_length = 0;
        GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                      ::srcs_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                             ::srcs_abi_cxx11_);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=
              ((string *)
               &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                srcs_abi_cxx11_,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    _Var10 = GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
             srcs_abi_cxx11_._M_dataplus;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  return _Var10._M_p;
}

Assistant:

const char* cmTargetPropertyComputer::GetSources<cmTarget>(
  cmTarget const* tgt, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  cmStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return nullptr;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (std::string const& entry : entries) {
    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::string const& file : files) {
      if (cmHasLiteralPrefix(file, "$<TARGET_OBJECTS:") &&
          file.back() == '>') {
        std::string objLibName = file.substr(17, file.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << file;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        MessageType messageType = MessageType::AUTHOR_WARNING;
        switch (context.GetBottom().GetPolicy(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains $<TARGET_OBJECTS> generator expression in its "
               "sources list.  This content was not previously part of the "
               "SOURCES property when that property was read at configure "
               "time.  Code reading that property needs to be adapted to "
               "ignore the generator expression using the string(GENEX_STRIP) "
               "command.";
          messenger->IssueMessage(messageType, e.str(), context);
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << file;
        }
      } else if (cmGeneratorExpression::Find(file) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << file;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(file);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return srcs.c_str();
}